

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O0

StorageValueIgnorer<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>
supermap::io::
DeserializeHelper<supermap::StorageValueIgnorer<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>
::deserialize(istream *is)

{
  Key<3UL> KVar1;
  ulong uVar2;
  IOException *this;
  long in_RDI;
  StorageValueIgnorer<supermap::Key<3UL>,_supermap::ByteArray<4UL>_> svi;
  istream *in_stack_ffffffffffffff98;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  KVar1 = deserialize<supermap::Key<3ul>,void>(in_stack_ffffffffffffff98);
  std::istream::seekg(in_RDI,4);
  uVar2 = std::ios::fail();
  if ((uVar2 & 1) == 0) {
    return (Key<3UL>)(Key<3UL>)KVar1.super_array<unsigned_char,_3UL>._M_elems;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  supermap::IOException::IOException(this,(string *)&stack0xffffffffffffffd0);
  __cxa_throw(this,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

static StorageValueIgnorer<Key, Value> deserialize(std::istream &is) {
        StorageValueIgnorer<Key, Value> svi{io::deserialize<Key>(is)};
        is.seekg(FixedDeserializedSizeRegister<Value>::exactDeserializedSize, std::ios_base::cur);
        if (is.fail()) {
            throw IOException("StorageValueIgnorer deserialization fail: seekg failed");
        }
        return svi;
    }